

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall
chrono::ChSystemDescriptor::FromUnknownsToVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector,bool resize_vector)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  ChVariables *pCVar8;
  double *pdVar9;
  ChConstraint *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  uint uVar18;
  Index size;
  ulong uVar19;
  undefined7 in_register_00000011;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ActualDstType actualDst;
  undefined1 auVar27 [16];
  ChVectorRef local_48;
  
  iVar17 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar17;
  iVar17 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar17;
  if ((int)CONCAT71(in_register_00000011,resize_vector) != 0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar17 + (long)this->n_q);
    lVar26 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar26 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar26 != 0) {
      memset((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar26 << 3);
    }
  }
  ppCVar5 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar6 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar26 = ((long)(this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start) * 0x20000000;
  if (lVar26 != 0) {
    lVar26 = lVar26 >> 0x20;
    lVar21 = 0;
    do {
      ppCVar7 = (this->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar7[lVar21]->disabled == false) {
        ChVariables::Get_qb(&local_48,ppCVar7[lVar21]);
        pCVar8 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar21];
        uVar4 = pCVar8->offset;
        uVar18 = (*pCVar8->_vptr_ChVariables[2])();
        pdVar9 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar18 < 0 && pdVar9 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        uVar19 = (ulong)(int)uVar18;
        if (((int)(uVar18 | uVar4) < 0) ||
           ((long)((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows - uVar19) < (long)(int)uVar4)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != uVar19) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                       );
        }
        pdVar9 = pdVar9 + (int)uVar4;
        uVar20 = uVar19;
        if ((((ulong)pdVar9 & 7) == 0) &&
           (uVar20 = (ulong)(-((uint)((ulong)pdVar9 >> 3) & 0x1fffffff) & 7),
           (long)uVar19 <= (long)uVar20)) {
          uVar20 = uVar19;
        }
        uVar23 = uVar19 - uVar20;
        uVar22 = uVar23 + 7;
        if (-1 < (long)uVar23) {
          uVar22 = uVar23;
        }
        if (0 < (long)uVar20) {
          uVar25 = 0;
          do {
            pdVar9[uVar25] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar25 * 8);
            uVar25 = uVar25 + 1;
          } while (uVar20 != uVar25);
        }
        uVar22 = (uVar22 & 0xfffffffffffffff8) + uVar20;
        if (7 < (long)uVar23) {
          do {
            pdVar1 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar20 * 8);
            dVar3 = pdVar1[1];
            dVar11 = pdVar1[2];
            dVar12 = pdVar1[3];
            dVar13 = pdVar1[4];
            dVar14 = pdVar1[5];
            dVar15 = pdVar1[6];
            dVar16 = pdVar1[7];
            pdVar2 = pdVar9 + uVar20;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar3;
            pdVar2[2] = dVar11;
            pdVar2[3] = dVar12;
            pdVar2[4] = dVar13;
            pdVar2[5] = dVar14;
            pdVar2[6] = dVar15;
            pdVar2[7] = dVar16;
            uVar20 = uVar20 + 8;
          } while ((long)uVar20 < (long)uVar22);
        }
        if ((long)uVar22 < (long)uVar19) {
          do {
            pdVar9[uVar22] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar22 * 8);
            uVar22 = uVar22 + 1;
          } while (uVar19 != uVar22);
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar26 + (ulong)(lVar26 == 0));
  }
  lVar26 = ((long)ppCVar5 - (long)ppCVar6) * 0x20000000;
  if (lVar26 != 0) {
    lVar26 = lVar26 >> 0x20;
    ppCVar5 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar17 = this->n_q;
    pdVar9 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar21 = 0;
    do {
      pCVar10 = ppCVar5[lVar21];
      if (pCVar10->active == true) {
        lVar24 = (long)pCVar10->offset + (long)iVar17;
        if (((int)lVar24 < 0) ||
           ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= lVar24)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        auVar27._0_8_ = -pCVar10->l_i;
        auVar27._8_4_ = 0;
        auVar27._12_4_ = 0x80000000;
        dVar3 = (double)vmovlps_avx(auVar27);
        pdVar9[lVar24] = dVar3;
      }
      lVar21 = lVar21 + 1;
    } while (lVar26 + (ulong)(lVar26 == 0) != lVar21);
  }
  return this->n_c + this->n_q;
}

Assistant:

int ChSystemDescriptor::FromUnknownsToVector(ChVectorDynamic<>& mvector, bool resize_vector) {
    // Count active variables & constraints and resize vector if necessary
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    if (resize_vector) {
        mvector.setZero(n_q + n_c);
    }

    auto vv_size = (int)vvariables.size();
    auto vc_size = (int)vconstraints.size();

    // Fill the first part of vector, x.q ,with variables q
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_qb();
        }
    }

    // Fill the second part of vector, x.l, with constraint multipliers -l (with flipped sign!)
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            mvector(vconstraints[ic]->GetOffset() + n_q) = -vconstraints[ic]->Get_l_i();
        }
    }

    return n_q + n_c;
}